

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

int ps_free(ps_decoder_t *ps)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (ps != (ps_decoder_t *)0x0) {
    iVar1 = ps->refcount;
    iVar2 = iVar1 + -1;
    ps->refcount = iVar2;
    if (iVar1 < 2) {
      ps_free_searches(ps);
      dict_free(ps->dict);
      dict2pid_free(ps->d2p);
      acmod_free(ps->acmod);
      logmath_free(ps->lmath);
      ps_config_free(ps->config);
      ckd_free(ps);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
ps_free(ps_decoder_t *ps)
{
    if (ps == NULL)
        return 0;
    if (--ps->refcount > 0)
        return ps->refcount;
    ps_free_searches(ps);
    dict_free(ps->dict);
    dict2pid_free(ps->d2p);
    acmod_free(ps->acmod);
    logmath_free(ps->lmath);
    ps_config_free(ps->config);
    ckd_free(ps);
    return 0;
}